

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

box_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
::
box_from_bounds<pico_tree::internal::space_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,std::array<float,3ul>>
          (build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>,_3UL>
           *this,space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 space,bounds_t<std::array<float,_3UL>_> *bounds)

{
  array<float,_3UL> *paVar1;
  bounds_t<std::array<float,_3UL>_> *in_RCX;
  box_base<pico_tree::internal::box<float,_3UL>_> *in_RSI;
  box_type *in_RDI;
  point_wrapper<std::array<float,_3UL>_> max;
  point_wrapper<std::array<float,_3UL>_> min;
  point_wrapper<std::array<float,_3UL>_> local_28;
  point_wrapper<std::array<float,_3UL>_> local_20;
  space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  local_8;
  
  paVar1 = bounds_t<std::array<float,_3UL>_>::min(in_RCX);
  point_wrapper<std::array<float,_3UL>_>::point_wrapper(&local_20,paVar1);
  paVar1 = bounds_t<std::array<float,_3UL>_>::max(in_RCX);
  point_wrapper<std::array<float,_3UL>_>::point_wrapper(&local_28,paVar1);
  space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
  sdim(&local_8);
  box_base<pico_tree::internal::box<float,_3UL>_>::make_inverse_max((size_type)in_RDI);
  point_wrapper<std::array<float,_3UL>_>::begin((point_wrapper<std::array<float,_3UL>_> *)0x10a04a);
  box_base<pico_tree::internal::box<float,_3UL>_>::fit(in_RSI,(scalar_type *)in_RCX);
  point_wrapper<std::array<float,_3UL>_>::begin((point_wrapper<std::array<float,_3UL>_> *)0x10a060);
  box_base<pico_tree::internal::box<float,_3UL>_>::fit(in_RSI,(scalar_type *)in_RCX);
  return in_RDI;
}

Assistant:

box_type box_from_bounds(
      SpaceWrapper_ space, bounds_t<Point_> const& bounds) const {
    internal::point_wrapper<Point_> min(bounds.min());
    internal::point_wrapper<Point_> max(bounds.max());
    box_type bbox = box_type::make_inverse_max(space.sdim());
    bbox.fit(min.begin());
    bbox.fit(max.begin());
    return bbox;
  }